

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::OpenCompactionOutputFile(DBImpl *this,CompactionState *compact)

{
  _func_int **pp_Var1;
  int iVar2;
  TableBuilder *this_00;
  undefined8 uVar3;
  long in_RDX;
  void *unaff_R13;
  long in_FS_OFFSET;
  uint64_t file_number;
  string fname;
  _func_int **local_90;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x31d,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
  }
  if (*(long *)(in_RDX + 0x30) == 0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&compact[3].smallest_snapshot);
    if (iVar2 == 0) {
      local_90 = compact[8].outfile[9]._vptr_WritableFile;
      compact[8].outfile[9]._vptr_WritableFile = (_func_int **)((long)local_90 + 1);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&compact[7].outfile,(unsigned_long *)&local_90);
      local_88._24_8_ = 0;
      local_68._M_local_buf[0] = '\0';
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      local_88._0_8_ = local_90;
      local_88._16_8_ = &local_68;
      local_58._M_p = (pointer)&local_48;
      std::
      vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ::push_back((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                   *)(in_RDX + 0x10),(value_type *)local_88);
      pthread_mutex_unlock((pthread_mutex_t *)&compact[3].smallest_snapshot);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,
                        CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._16_8_ != &local_68) {
        operator_delete((void *)local_88._16_8_,
                        CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1)
        ;
      }
      TableFileName((string *)local_88,
                    (string *)
                    &compact[2].outputs.
                     super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(uint64_t)local_90);
      (**(code **)(*(long *)compact->smallest_snapshot + 0x20))
                (this,(long *)compact->smallest_snapshot,(string *)local_88,
                 (undefined8 *)(in_RDX + 0x28));
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        this_00 = (TableBuilder *)operator_new(8);
        TableBuilder::TableBuilder
                  (this_00,(Options *)&compact->builder,*(WritableFile **)(in_RDX + 0x28));
        *(TableBuilder **)(in_RDX + 0x30) = this_00;
      }
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (Status)(char *)this;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar3 = std::__throw_system_error(iVar2);
      operator_delete(unaff_R13,8);
      pp_Var1 = (this->super_DB)._vptr_DB;
      if (pp_Var1 != (_func_int **)0x0) {
        operator_delete__(pp_Var1);
      }
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar3);
      }
    }
    __stack_chk_fail();
  }
  __assert_fail("compact->builder == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                ,0x31e,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
}

Assistant:

Status DBImpl::OpenCompactionOutputFile(CompactionState* compact) {
  assert(compact != nullptr);
  assert(compact->builder == nullptr);
  uint64_t file_number;
  {
    mutex_.Lock();
    file_number = versions_->NewFileNumber();
    pending_outputs_.insert(file_number);
    CompactionState::Output out;
    out.number = file_number;
    out.smallest.Clear();
    out.largest.Clear();
    compact->outputs.push_back(out);
    mutex_.Unlock();
  }

  // Make the output file
  std::string fname = TableFileName(dbname_, file_number);
  Status s = env_->NewWritableFile(fname, &compact->outfile);
  if (s.ok()) {
    compact->builder = new TableBuilder(options_, compact->outfile);
  }
  return s;
}